

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall
fasttext::NegativeSamplingLoss::NegativeSamplingLoss
          (NegativeSamplingLoss *this,shared_ptr<fasttext::Matrix> *wo,int neg,
          vector<long,_std::allocator<long>_> *targetCounts)

{
  iterator __position;
  pointer piVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer plVar5;
  pointer plVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  float local_3c;
  int local_34;
  undefined1 extraout_var_00 [56];
  
  Loss::Loss((Loss *)this,wo);
  (this->super_BinaryLogisticLoss).super_Loss._vptr_Loss =
       (_func_int **)&PTR__NegativeSamplingLoss_00146a98;
  this->neg_ = neg;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->uniform_)._M_param._M_a = 0;
  (this->uniform_)._M_param._M_b = 0xffffffffffffffff;
  plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  plVar6 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar6 == plVar5) {
    local_3c = 0.0;
  }
  else {
    local_3c = 0.0;
    uVar8 = 0;
    auVar14 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    do {
      auVar9._0_8_ = (double)plVar5[uVar8];
      auVar9._8_8_ = in_XMM4_Qb;
      if (auVar9._0_8_ < 0.0) {
        auVar14._0_8_ = sqrt(auVar9._0_8_);
        auVar14._8_56_ = extraout_var;
        auVar9 = auVar14._0_16_;
        auVar14 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      }
      else {
        auVar9 = vsqrtsd_avx(auVar9,auVar9);
      }
      auVar9 = vandpd_avx(auVar9,auVar14._0_16_);
      local_3c = (float)(auVar9._0_8_ + (double)local_3c);
      uVar8 = uVar8 + 1;
      plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      plVar6 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar8 < (ulong)((long)plVar6 - (long)plVar5 >> 3));
  }
  if (plVar6 != plVar5) {
    uVar8 = 0;
    do {
      auVar11._0_8_ = (double)plVar5[uVar8];
      auVar11._8_8_ = in_XMM4_Qb;
      if (auVar11._0_8_ < 0.0) {
        auVar13._0_8_ = sqrt(auVar11._0_8_);
        auVar13._8_56_ = extraout_var_00;
        auVar9 = auVar13._0_16_;
      }
      else {
        auVar9 = vsqrtsd_avx(auVar11,auVar11);
      }
      auVar12._0_4_ = (float)auVar9._0_8_;
      auVar12._4_12_ = auVar9._4_12_;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar9 = vandps_avx512vl(auVar12,auVar3);
      fVar10 = (auVar9._0_4_ * 1e+07) / local_3c;
      if (0.0 < fVar10) {
        lVar7 = 1;
        do {
          local_34 = (int)uVar8;
          __position._M_current =
               (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->negatives_,__position,&local_34);
          }
          else {
            *__position._M_current = local_34;
            (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          auVar4._8_8_ = in_XMM4_Qb;
          auVar4._0_8_ = in_XMM4_Qa;
          auVar9 = vcvtusi2ss_avx512f(auVar4,lVar7);
          lVar7 = lVar7 + 1;
        } while (auVar9._0_4_ < fVar10);
      }
      uVar8 = uVar8 + 1;
      plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(targetCounts->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
  }
  piVar1 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->uniform_)._M_param._M_a = 0;
  (this->uniform_)._M_param._M_b = ((long)piVar1 - (long)piVar2 >> 2) - 1;
  return;
}

Assistant:

NegativeSamplingLoss::NegativeSamplingLoss(
    std::shared_ptr<Matrix>& wo,
    int neg,
    const std::vector<int64_t>& targetCounts)
    : BinaryLogisticLoss(wo), neg_(neg), negatives_(), uniform_() {
  real z = 0.0;
  for (size_t i = 0; i < targetCounts.size(); i++) {
    z += pow(targetCounts[i], 0.5);
  }
  for (size_t i = 0; i < targetCounts.size(); i++) {
    real c = pow(targetCounts[i], 0.5);
    for (size_t j = 0; j < c * NegativeSamplingLoss::NEGATIVE_TABLE_SIZE / z;
         j++) {
      negatives_.push_back(i);
    }
  }
  uniform_ = std::uniform_int_distribution<size_t>(0, negatives_.size() - 1);
}